

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O1

obj * select_rwep(monst *mtmp)

{
  char cVar1;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  obj *poVar5;
  int x;
  obj *unaff_R14;
  long lVar6;
  
  cVar1 = mtmp->data->mlet;
  propellor = &zeroobj;
  poVar5 = oselect(mtmp,0x10f);
  if (((poVar5 == (obj *)0x0) &&
      ((cVar1 != '%' || (poVar5 = oselect(mtmp,0x120), poVar5 == (obj *)0x0)))) &&
     (((mtmp->data->mflags2 & 0x8000000) == 0 ||
      (poVar5 = oselect(mtmp,0x214), poVar5 == (obj *)0x0)))) {
    iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)mtmp->mux,(int)mtmp->muy);
    if ((iVar4 < 0xe) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) {
      lVar6 = 0;
      do {
        if ((((mtmp->data->mflags2 & 0x4000000) != 0) && ((mtmp->misc_worn_check & 8) == 0)) ||
           ((objects[*(int *)((long)pwep + lVar6)].field_0x11 & 1) == 0)) {
          iVar4 = *(int *)((long)pwep + lVar6);
          unaff_R14 = (obj *)(long)iVar4;
          if ((((*(ushort *)&objects[(long)unaff_R14].field_0x11 & 0x1f0) != 0xe0) ||
              (bVar3 = hates_silver(mtmp->data), bVar3 == '\0')) &&
             (poVar5 = oselect(mtmp,iVar4), poVar5 != (obj *)0x0)) {
            propellor = poVar5;
            return poVar5;
          }
        }
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x34);
    }
    lVar6 = 0;
    do {
      if (((lVar6 == 0x16) && ((mtmp->data->mflags2 & 0x20000000) == 0)) &&
         (poVar5 = m_carrying(mtmp,0x46), poVar5 != (obj *)0x0)) {
        for (poVar5 = mtmp->minvent; poVar5 != (obj *)0x0; poVar5 = poVar5->nobj) {
          if ((poVar5->oclass == '\r') &&
             ((poVar5->otyp != 0x210 || ((poVar5->field_0x4a & 1) == 0)))) {
            propellor = m_carrying(mtmp,0x46);
            bVar2 = false;
            unaff_R14 = poVar5;
            goto LAB_002833c1;
          }
        }
      }
      propellor = &zeroobj;
      iVar4 = rwep[lVar6];
      cVar1 = objects[iVar4].oc_subtyp;
      if (cVar1 < '\0') {
        if (cVar1 == -0x18) {
          x = 0x47;
LAB_002833e7:
          propellor = oselect(mtmp,x);
        }
        else {
          if (cVar1 == -0x17) {
            x = 0x46;
            goto LAB_002833e7;
          }
          if (cVar1 == -0x16) {
            propellor = oselect(mtmp,0x45);
            if (propellor == (obj *)0x0) {
              propellor = oselect(mtmp,0x43);
            }
            if (propellor == (obj *)0x0) {
              propellor = oselect(mtmp,0x42);
            }
            if (propellor == (obj *)0x0) {
              x = 0x44;
              goto LAB_002833e7;
            }
          }
        }
        poVar5 = mtmp->mw;
        if ((((poVar5 != (obj *)0x0) && ((poVar5->field_0x4a & 1) != 0)) && (poVar5 != propellor))
           && (mtmp->weapon_check == '\0')) {
          propellor = (obj *)0x0;
        }
      }
      if (propellor == (obj *)0x0) {
LAB_002833bf:
        bVar2 = true;
      }
      else {
        if (lVar6 == 0x14) {
          for (poVar5 = mtmp->minvent; poVar5 != (obj *)0x0; poVar5 = poVar5->nobj) {
            if ((poVar5->otyp == 0x210) && ((poVar5->field_0x4a & 1) == 0)) goto LAB_00283444;
          }
          goto LAB_002833bf;
        }
        poVar5 = oselect(mtmp,iVar4);
        if (((poVar5 == (obj *)0x0) || (poVar5->oartifact != '\0')) ||
           (((poVar5->field_0x4a & 1) != 0 && (poVar5 == mtmp->mw)))) goto LAB_002833bf;
LAB_00283444:
        bVar2 = false;
        unaff_R14 = poVar5;
      }
LAB_002833c1:
      if (!bVar2) {
        return unaff_R14;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x18);
    poVar5 = (obj *)0x0;
  }
  return poVar5;
}

Assistant:

struct obj *select_rwep(struct monst *mtmp)
{
	struct obj *otmp;
	int i;

	char mlet = mtmp->data->mlet;

	propellor = &zeroobj;
	Oselect(EGG); /* cockatrice egg */
	if (mlet == S_KOP)	/* pies are first choice for Kops */
	    Oselect(CREAM_PIE);
	if (throws_rocks(mtmp->data))	/* ...boulders for giants */
	    Oselect(BOULDER);

	/* Select polearms first; they do more damage and aren't expendable */
	/* The limit of 13 here is based on the monster polearm range limit
	 * (defined as 5 in mthrowu.c).  5 corresponds to a distance of 2 in
	 * one direction and 1 in another; one space beyond that would be 3 in
	 * one direction and 2 in another; 3^2+2^2=13.
	 */
	if (dist2(mtmp->mx, mtmp->my, mtmp->mux, mtmp->muy) <= 13 && couldsee(mtmp->mx, mtmp->my)) {
	    for (i = 0; i < SIZE(pwep); i++) {
		/* Only strong monsters can wield big (esp. long) weapons.
		 * Big weapon is basically the same as bimanual.
		 * All monsters can wield the remaining weapons.
		 */
		if (((strongmonst(mtmp->data) && (mtmp->misc_worn_check & W_ARMS) == 0)
			|| !objects[pwep[i]].oc_bimanual) &&
		    (objects[pwep[i]].oc_material != SILVER
			|| !hates_silver(mtmp->data))) {
		    if ((otmp = oselect(mtmp, pwep[i])) != 0) {
			propellor = otmp; /* force the monster to wield it */
			return otmp;
		    }
		}
	    }
	}

	/*
	 * other than these two specific cases, always select the
	 * most potent ranged weapon to hand.
	 */
	for (i = 0; i < SIZE(rwep); i++) {
	    int prop;

	    /* shooting gems from slings; this goes just before the darts */
	    /* (shooting rocks is already handled via the rwep[] ordering) */
	    if (rwep[i] == DART && !likes_gems(mtmp->data) &&
		    m_carrying(mtmp, SLING)) {		/* propellor */
		for (otmp = mtmp->minvent; otmp; otmp = otmp->nobj)
		    if (otmp->oclass == GEM_CLASS &&
			    (otmp->otyp != LOADSTONE || !otmp->cursed)) {
			propellor = m_carrying(mtmp, SLING);
			return otmp;
		    }
	    }

		/* KMH -- This belongs here so darts will work */
	    propellor = &zeroobj;

	    prop = (objects[rwep[i]]).oc_skill;
	    if (prop < 0) {
		switch (-prop) {
		case P_BOW:
		  propellor = (oselect(mtmp, YUMI));
		  if (!propellor) propellor = (oselect(mtmp, ELVEN_BOW));
		  if (!propellor) propellor = (oselect(mtmp, BOW));
		  if (!propellor) propellor = (oselect(mtmp, ORCISH_BOW));
		  break;
		case P_SLING:
		  propellor = (oselect(mtmp, SLING));
		  break;
		case P_CROSSBOW:
		  propellor = (oselect(mtmp, CROSSBOW));
		}
		if ((otmp = MON_WEP(mtmp)) && otmp->cursed && otmp != propellor
				&& mtmp->weapon_check == NO_WEAPON_WANTED)
			propellor = 0;
	    }
	    /* propellor = obj, propellor to use
	     * propellor = &zeroobj, doesn't need a propellor
	     * propellor = 0, needed one and didn't have one
	     */
	    if (propellor != 0) {
		/* Note: cannot use m_carrying for loadstones, since it will
		 * always select the first object of a type, and maybe the
		 * monster is carrying two but only the first is unthrowable.
		 */
		if (rwep[i] != LOADSTONE) {
			/* Don't throw a cursed weapon-in-hand or an artifact */
			if ((otmp = oselect(mtmp, rwep[i])) && !otmp->oartifact
			    && (!otmp->cursed || otmp != MON_WEP(mtmp)))
				return otmp;
		} else for (otmp=mtmp->minvent; otmp; otmp=otmp->nobj) {
		    if (otmp->otyp == LOADSTONE && !otmp->cursed)
			return otmp;
		}
	    }
	  }

	/* failure */
	return NULL;
}